

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_OStream_Test::TestBody(PrintfTest_OStream_Test *this)

{
  bool bVar1;
  Type type;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int ret;
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  char *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  int line;
  ostringstream *this_01;
  AssertHelper *in_stack_fffffffffffffe00;
  char (*in_stack_fffffffffffffe08) [10];
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  AssertionResult local_1e8 [2];
  string local_1c8 [16];
  Message *in_stack_fffffffffffffe48;
  AssertHelper *in_stack_fffffffffffffe50;
  AssertionResult local_1a8 [2];
  Type local_184;
  ostringstream local_180 [384];
  
  this_01 = local_180;
  std::__cxx11::ostringstream::ostringstream(this_01);
  type = fmt::v5::fprintf<char[10],char[6]>
                   ((basic_ostream<char,_std::char_traits<char>_> *)
                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                    in_stack_fffffffffffffe08,(char (*) [6])in_stack_fffffffffffffe00);
  local_184 = type;
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0,
             (char (*) [13])CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0);
  std::__cxx11::string::~string(local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdec);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffde0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1381f1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,type,(char *)this_01,line,in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
    testing::Message::~Message((Message *)0x13823f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13828e);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(line,in_stack_fffffffffffffde8),in_stack_fffffffffffffde0,
             (int *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (int *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13831d)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,type,(char *)this_01,line,in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13836b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1383b7);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

TEST(PrintfTest, OStream) {
  std::ostringstream os;
  int ret = fmt::fprintf(os, "Don't %s!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  EXPECT_EQ(12, ret);
}